

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O3

void secp256k1_fe_from_signed62(secp256k1_fe *r,secp256k1_modinv64_signed62 *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  byte bVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  int iVar109;
  uint uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  uint uVar115;
  long lVar116;
  uint n;
  secp256k1_ge *extraout_RDX;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  ulong uVar120;
  ulong uVar121;
  secp256k1_ge *unaff_RBX;
  uint uVar122;
  secp256k1_ge *unaff_RBP;
  secp256k1_ge *psVar123;
  secp256k1_ge *psVar124;
  ulong uVar125;
  ulong uVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  ulong uVar133;
  ulong uVar134;
  ulong uVar135;
  ulong unaff_R12;
  ulong unaff_R13;
  secp256k1_ge *unaff_R14;
  int iVar136;
  uint64_t unaff_R15;
  undefined1 uVar137;
  byte bVar138;
  undefined1 auVar139 [16];
  undefined1 auStack_178 [48];
  ulong uStack_148;
  ulong uStack_140;
  secp256k1_ge *psStack_138;
  uint64_t uStack_130;
  secp256k1_ge *psStack_128;
  secp256k1_ge *psStack_118;
  secp256k1_ge *psStack_110;
  secp256k1_ge *psStack_108;
  undefined1 auStack_100 [96];
  undefined1 auStack_a0 [16];
  ulong uStack_90;
  ulong uStack_88;
  byte abStack_80 [32];
  undefined1 auStack_60 [16];
  ulong uStack_50;
  ulong uStack_48;
  
  bVar138 = 0;
  uVar112 = a->v[0];
  if (uVar112 >> 0x3e == 0) {
    uVar113 = a->v[1];
    if (0x3fffffffffffffff < uVar113) goto LAB_00149445;
    uVar114 = a->v[2];
    if (0x3fffffffffffffff < uVar114) goto LAB_0014944a;
    uVar111 = a->v[3];
    if (0x3fffffffffffffff < uVar111) goto LAB_0014944f;
    uVar125 = a->v[4];
    if (uVar125 < 0x100) {
      r->n[0] = uVar112 & 0xfffffffffffff;
      r->n[1] = (uVar113 & 0x3ffffffffff) << 10 | uVar112 >> 0x34;
      r->n[2] = (uVar114 & 0xffffffff) << 0x14 | uVar113 >> 0x2a;
      r->n[3] = (ulong)((uint)uVar111 & 0x3fffff) << 0x1e | uVar114 >> 0x20;
      r->n[4] = uVar125 << 0x28 | uVar111 >> 0x16;
      return;
    }
  }
  else {
    secp256k1_fe_from_signed62_cold_5();
LAB_00149445:
    secp256k1_fe_from_signed62_cold_4();
LAB_0014944a:
    secp256k1_fe_from_signed62_cold_3();
LAB_0014944f:
    secp256k1_fe_from_signed62_cold_2();
  }
  secp256k1_fe_from_signed62_cold_1();
  if ((secp256k1_ge *)r == extraout_RDX) {
    psStack_128 = (secp256k1_ge *)0x149e84;
    secp256k1_scalar_split_lambda_cold_6();
LAB_00149e84:
    psStack_128 = (secp256k1_ge *)0x149e89;
    secp256k1_scalar_split_lambda_cold_5();
LAB_00149e89:
    psStack_128 = (secp256k1_ge *)0x149e8e;
    secp256k1_scalar_split_lambda_cold_4();
  }
  else {
    if ((secp256k1_ge *)a == extraout_RDX) goto LAB_00149e84;
    if (r == (secp256k1_fe *)a) goto LAB_00149e89;
    uVar112 = (extraout_RDX->x).n[0];
    uVar113 = (extraout_RDX->x).n[1];
    uVar114 = (extraout_RDX->x).n[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar112;
    uVar117 = SUB168(auVar1 * ZEXT816(0xe893209a45dbb031),8);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar117;
    auStack_100._32_8_ = SUB168(auVar1 * ZEXT816(0xe893209a45dbb031),0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar112;
    auVar2 = auVar2 * ZEXT816(0x3daa8a1471e8ca7f);
    uVar125 = SUB168(auVar2 + auVar103,0);
    uVar130 = SUB168(auVar2 + auVar103,8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar113;
    uVar118 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),8);
    uVar111 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),0);
    auStack_100._40_8_ = uVar125 + uVar111;
    uVar111 = (ulong)CARRY8(uVar125,uVar111);
    uVar125 = uVar130 + uVar118;
    uVar131 = uVar125 + uVar111;
    uVar132 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar117,auVar2._0_8_)) +
              (ulong)(CARRY8(uVar130,uVar118) || CARRY8(uVar125,uVar111));
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar112;
    uVar119 = SUB168(auVar4 * ZEXT816(0xe86c90e49284eb15),8);
    uVar111 = SUB168(auVar4 * ZEXT816(0xe86c90e49284eb15),0);
    uVar117 = uVar131 + uVar111;
    uVar111 = (ulong)CARRY8(uVar131,uVar111);
    uVar118 = uVar132 + uVar119;
    uVar133 = uVar118 + uVar111;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar113;
    uVar120 = SUB168(auVar5 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar125 = SUB168(auVar5 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar131 = uVar117 + uVar125;
    uVar125 = (ulong)CARRY8(uVar117,uVar125);
    uVar130 = uVar133 + uVar120;
    uVar134 = uVar130 + uVar125;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar114;
    uVar121 = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),8);
    uVar117 = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),0);
    auStack_100._48_8_ = uVar131 + uVar117;
    uVar117 = (ulong)CARRY8(uVar131,uVar117);
    uVar131 = uVar134 + uVar121;
    uVar135 = uVar131 + uVar117;
    uVar126 = (ulong)(CARRY8(uVar132,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar133,uVar120) || CARRY8(uVar130,uVar125)) +
              (ulong)(CARRY8(uVar134,uVar121) || CARRY8(uVar131,uVar117));
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar112;
    uVar121 = SUB168(auVar7 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar112 = SUB168(auVar7 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar117 = uVar135 + uVar112;
    uVar111 = (ulong)CARRY8(uVar135,uVar112);
    uVar130 = uVar126 + uVar121;
    uVar135 = uVar130 + uVar111;
    uVar112 = (extraout_RDX->x).n[3];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar113;
    uVar132 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),8);
    uVar125 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),0);
    uVar118 = uVar117 + uVar125;
    uVar125 = (ulong)CARRY8(uVar117,uVar125);
    uVar131 = uVar135 + uVar132;
    uVar127 = uVar131 + uVar125;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar114;
    uVar133 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar117 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar120 = uVar118 + uVar117;
    uVar117 = (ulong)CARRY8(uVar118,uVar117);
    uVar119 = uVar127 + uVar133;
    uVar128 = uVar119 + uVar117;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar112;
    uVar134 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),8);
    uVar118 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),0);
    auStack_100._56_8_ = uVar120 + uVar118;
    uVar118 = (ulong)CARRY8(uVar120,uVar118);
    uVar120 = uVar128 + uVar134;
    uVar129 = uVar120 + uVar118;
    uVar121 = (ulong)(CARRY8(uVar126,uVar121) || CARRY8(uVar130,uVar111)) +
              (ulong)(CARRY8(uVar135,uVar132) || CARRY8(uVar131,uVar125)) +
              (ulong)(CARRY8(uVar127,uVar133) || CARRY8(uVar119,uVar117)) +
              (ulong)(CARRY8(uVar128,uVar134) || CARRY8(uVar120,uVar118));
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar113;
    uVar131 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar113 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar125 = uVar129 + uVar113;
    uVar113 = (ulong)CARRY8(uVar129,uVar113);
    uVar117 = uVar121 + uVar131;
    uVar132 = uVar117 + uVar113;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar114;
    uVar119 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),8);
    uVar111 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),0);
    uVar130 = uVar125 + uVar111;
    uVar111 = (ulong)CARRY8(uVar125,uVar111);
    uVar118 = uVar132 + uVar119;
    uVar133 = uVar118 + uVar111;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar112;
    uVar120 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar125 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),0);
    auStack_100._64_8_ = uVar130 + uVar125;
    uVar125 = (ulong)CARRY8(uVar130,uVar125);
    uVar130 = uVar133 + uVar120;
    uVar134 = uVar130 + uVar125;
    uVar130 = (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar113)) +
              (ulong)(CARRY8(uVar132,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar133,uVar120) || CARRY8(uVar130,uVar125));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar114;
    uVar117 = SUB168(auVar14 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar113 = SUB168(auVar14 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar125 = uVar134 + uVar113;
    uVar113 = (ulong)CARRY8(uVar134,uVar113);
    uVar111 = uVar130 + uVar117;
    uVar131 = uVar111 + uVar113;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar112;
    uVar118 = SUB168(auVar15 * ZEXT816(0xe86c90e49284eb15),8);
    uVar114 = SUB168(auVar15 * ZEXT816(0xe86c90e49284eb15),0);
    auStack_100._72_8_ = uVar125 + uVar114;
    uVar114 = (ulong)CARRY8(uVar125,uVar114);
    uVar125 = uVar131 + uVar118;
    auStack_100._88_8_ =
         (ulong)(CARRY8(uVar130,uVar117) || CARRY8(uVar111,uVar113)) +
         (ulong)(CARRY8(uVar131,uVar118) || CARRY8(uVar125,uVar114));
    auStack_100._80_8_ = uVar125 + uVar114;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar112;
    auStack_100._80_16_ = auVar16 * ZEXT816(0x3086d221a7d46bcd) + auStack_100._80_16_;
    uStack_90 = 0;
    uStack_88 = 0;
    psStack_128 = (secp256k1_ge *)0x149615;
    psStack_118 = (secp256k1_ge *)r;
    psStack_110 = extraout_RDX;
    psStack_108 = (secp256k1_ge *)a;
    auStack_a0 = auStack_100._80_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_a0,0,(uint)((ulong)auStack_100._72_8_ >> 0x3f));
    uVar112 = (psStack_110->x).n[0];
    uVar113 = (psStack_110->x).n[1];
    uVar114 = (psStack_110->x).n[2];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar112;
    uVar117 = SUB168(auVar17 * ZEXT816(0x1571b4ae8ac47f71),8);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar117;
    auStack_100._32_8_ = SUB168(auVar17 * ZEXT816(0x1571b4ae8ac47f71),0);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar112;
    auVar18 = auVar18 * ZEXT816(0x221208ac9df506c6);
    uVar125 = SUB168(auVar18 + auVar104,0);
    uVar130 = SUB168(auVar18 + auVar104,8);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar113;
    uVar118 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar111 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_100._40_8_ = uVar125 + uVar111;
    uVar111 = (ulong)CARRY8(uVar125,uVar111);
    uVar125 = uVar130 + uVar118;
    uVar131 = uVar125 + uVar111;
    uVar132 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar117,auVar18._0_8_)) +
              (ulong)(CARRY8(uVar130,uVar118) || CARRY8(uVar125,uVar111));
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar112;
    uVar119 = SUB168(auVar20 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar111 = SUB168(auVar20 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar117 = uVar131 + uVar111;
    uVar111 = (ulong)CARRY8(uVar131,uVar111);
    uVar118 = uVar132 + uVar119;
    uVar133 = uVar118 + uVar111;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar113;
    uVar120 = SUB168(auVar21 * ZEXT816(0x221208ac9df506c6),8);
    uVar125 = SUB168(auVar21 * ZEXT816(0x221208ac9df506c6),0);
    uVar131 = uVar117 + uVar125;
    uVar125 = (ulong)CARRY8(uVar117,uVar125);
    uVar130 = uVar133 + uVar120;
    uVar134 = uVar130 + uVar125;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar114;
    uVar121 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar117 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_100._48_8_ = uVar131 + uVar117;
    uVar117 = (ulong)CARRY8(uVar131,uVar117);
    uVar131 = uVar134 + uVar121;
    uVar135 = uVar131 + uVar117;
    uVar126 = (ulong)(CARRY8(uVar132,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar133,uVar120) || CARRY8(uVar130,uVar125)) +
              (ulong)(CARRY8(uVar134,uVar121) || CARRY8(uVar131,uVar117));
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar112;
    uVar121 = SUB168(auVar23 * ZEXT816(0xe4437ed6010e8828),8);
    uVar112 = SUB168(auVar23 * ZEXT816(0xe4437ed6010e8828),0);
    uVar117 = uVar135 + uVar112;
    uVar111 = (ulong)CARRY8(uVar135,uVar112);
    uVar130 = uVar126 + uVar121;
    uVar135 = uVar130 + uVar111;
    uVar112 = (psStack_110->x).n[3];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar113;
    uVar132 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar125 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar118 = uVar117 + uVar125;
    uVar125 = (ulong)CARRY8(uVar117,uVar125);
    uVar131 = uVar135 + uVar132;
    uVar127 = uVar131 + uVar125;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar114;
    uVar133 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),8);
    uVar117 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),0);
    uVar120 = uVar118 + uVar117;
    uVar117 = (ulong)CARRY8(uVar118,uVar117);
    uVar119 = uVar127 + uVar133;
    uVar128 = uVar119 + uVar117;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar112;
    uVar134 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar118 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_100._56_8_ = uVar120 + uVar118;
    uVar118 = (ulong)CARRY8(uVar120,uVar118);
    uVar120 = uVar128 + uVar134;
    uVar129 = uVar120 + uVar118;
    uVar121 = (ulong)(CARRY8(uVar126,uVar121) || CARRY8(uVar130,uVar111)) +
              (ulong)(CARRY8(uVar135,uVar132) || CARRY8(uVar131,uVar125)) +
              (ulong)(CARRY8(uVar127,uVar133) || CARRY8(uVar119,uVar117)) +
              (ulong)(CARRY8(uVar128,uVar134) || CARRY8(uVar120,uVar118));
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar113;
    uVar131 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),8);
    uVar113 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),0);
    uVar125 = uVar129 + uVar113;
    uVar113 = (ulong)CARRY8(uVar129,uVar113);
    uVar117 = uVar121 + uVar131;
    uVar132 = uVar117 + uVar113;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar114;
    uVar119 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar111 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar130 = uVar125 + uVar111;
    uVar111 = (ulong)CARRY8(uVar125,uVar111);
    uVar118 = uVar132 + uVar119;
    uVar133 = uVar118 + uVar111;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar112;
    uVar120 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),8);
    uVar125 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),0);
    auStack_100._64_8_ = uVar130 + uVar125;
    uVar125 = (ulong)CARRY8(uVar130,uVar125);
    uVar130 = uVar133 + uVar120;
    uVar134 = uVar130 + uVar125;
    uVar130 = (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar113)) +
              (ulong)(CARRY8(uVar132,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar133,uVar120) || CARRY8(uVar130,uVar125));
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar114;
    uVar117 = SUB168(auVar30 * ZEXT816(0xe4437ed6010e8828),8);
    uVar113 = SUB168(auVar30 * ZEXT816(0xe4437ed6010e8828),0);
    uVar125 = uVar134 + uVar113;
    uVar113 = (ulong)CARRY8(uVar134,uVar113);
    uVar111 = uVar130 + uVar117;
    uVar131 = uVar111 + uVar113;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar112;
    uVar118 = SUB168(auVar31 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar114 = SUB168(auVar31 * ZEXT816(0x6f547fa90abfe4c4),0);
    auStack_100._72_8_ = uVar125 + uVar114;
    uVar114 = (ulong)CARRY8(uVar125,uVar114);
    uVar125 = uVar131 + uVar118;
    auVar98._8_8_ =
         (ulong)(CARRY8(uVar130,uVar117) || CARRY8(uVar111,uVar113)) +
         (ulong)(CARRY8(uVar131,uVar118) || CARRY8(uVar125,uVar114));
    auVar98._0_8_ = uVar125 + uVar114;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar112;
    auStack_100._80_16_ = auVar32 * ZEXT816(0xe4437ed6010e8828) + auVar98;
    uStack_50 = 0;
    uStack_48 = 0;
    psStack_128 = (secp256k1_ge *)0x149793;
    auStack_60 = auStack_100._80_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_60,0,(uint)((ulong)auStack_100._72_8_ >> 0x3f));
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auStack_a0._0_8_;
    uVar114 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c3),8);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar114;
    auStack_100._32_8_ = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c3),0);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_a0._0_8_;
    auVar34 = auVar34 * ZEXT816(0xe4437ed6010e8828);
    uVar113 = SUB168(auVar34 + auVar105,0);
    uVar125 = SUB168(auVar34 + auVar105,8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auStack_a0._8_8_;
    uVar111 = SUB168(auVar35 * ZEXT816(0x6f547fa90abfe4c3),8);
    uVar112 = SUB168(auVar35 * ZEXT816(0x6f547fa90abfe4c3),0);
    auStack_100._40_8_ = uVar113 + uVar112;
    uVar112 = (ulong)CARRY8(uVar113,uVar112);
    uVar113 = uVar125 + uVar111;
    uVar117 = uVar113 + uVar112;
    uVar119 = (ulong)CARRY8(auVar34._8_8_,(ulong)CARRY8(uVar114,auVar34._0_8_)) +
              (ulong)(CARRY8(uVar125,uVar111) || CARRY8(uVar113,uVar112));
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auStack_a0._0_8_;
    uVar118 = SUB168(auVar36 * ZEXT816(0),8);
    uVar112 = SUB168(auVar36 * ZEXT816(0),0);
    uVar114 = uVar117 + uVar112;
    uVar112 = (ulong)CARRY8(uVar117,uVar112);
    uVar111 = uVar119 + uVar118;
    uVar120 = uVar111 + uVar112;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = auStack_a0._8_8_;
    uVar130 = SUB168(auVar37 * ZEXT816(0xe4437ed6010e8828),8);
    uVar113 = SUB168(auVar37 * ZEXT816(0xe4437ed6010e8828),0);
    uVar117 = uVar114 + uVar113;
    uVar113 = (ulong)CARRY8(uVar114,uVar113);
    uVar125 = uVar120 + uVar130;
    uVar121 = uVar125 + uVar113;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uStack_90;
    uVar131 = SUB168(auVar38 * ZEXT816(0x6f547fa90abfe4c3),8);
    uVar114 = SUB168(auVar38 * ZEXT816(0x6f547fa90abfe4c3),0);
    auStack_100._48_8_ = uVar117 + uVar114;
    uVar114 = (ulong)CARRY8(uVar117,uVar114);
    uVar117 = uVar121 + uVar131;
    uVar133 = uVar117 + uVar114;
    uVar132 = (ulong)(CARRY8(uVar119,uVar118) || CARRY8(uVar111,uVar112)) +
              (ulong)(CARRY8(uVar120,uVar130) || CARRY8(uVar125,uVar113)) +
              (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar114));
    auVar39._8_8_ = 0;
    auVar39._0_8_ = auStack_a0._0_8_;
    uVar131 = SUB168(auVar39 * ZEXT816(0),8);
    uVar112 = SUB168(auVar39 * ZEXT816(0),0);
    uVar114 = uVar133 + uVar112;
    uVar112 = (ulong)CARRY8(uVar133,uVar112);
    uVar125 = uVar132 + uVar131;
    uVar133 = uVar125 + uVar112;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = auStack_a0._8_8_;
    uVar119 = SUB168(auVar40 * ZEXT816(0),8);
    uVar113 = SUB168(auVar40 * ZEXT816(0),0);
    uVar111 = uVar114 + uVar113;
    uVar113 = (ulong)CARRY8(uVar114,uVar113);
    uVar117 = uVar133 + uVar119;
    uVar134 = uVar117 + uVar113;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uStack_90;
    uVar120 = SUB168(auVar41 * ZEXT816(0xe4437ed6010e8828),8);
    uVar114 = SUB168(auVar41 * ZEXT816(0xe4437ed6010e8828),0);
    uVar130 = uVar111 + uVar114;
    uVar114 = (ulong)CARRY8(uVar111,uVar114);
    uVar118 = uVar134 + uVar120;
    uVar126 = uVar118 + uVar114;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uStack_88;
    uVar121 = SUB168(auVar42 * ZEXT816(0x6f547fa90abfe4c3),8);
    uVar111 = SUB168(auVar42 * ZEXT816(0x6f547fa90abfe4c3),0);
    auStack_100._56_8_ = uVar130 + uVar111;
    uVar111 = (ulong)CARRY8(uVar130,uVar111);
    uVar130 = uVar126 + uVar121;
    uVar135 = uVar130 + uVar111;
    uVar119 = (ulong)(CARRY8(uVar132,uVar131) || CARRY8(uVar125,uVar112)) +
              (ulong)(CARRY8(uVar133,uVar119) || CARRY8(uVar117,uVar113)) +
              (ulong)(CARRY8(uVar134,uVar120) || CARRY8(uVar118,uVar114)) +
              (ulong)(CARRY8(uVar126,uVar121) || CARRY8(uVar130,uVar111));
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auStack_a0._8_8_;
    uVar118 = SUB168(auVar43 * ZEXT816(0),8);
    uVar112 = SUB168(auVar43 * ZEXT816(0),0);
    uVar114 = uVar135 + uVar112;
    uVar112 = (ulong)CARRY8(uVar135,uVar112);
    uVar111 = uVar119 + uVar118;
    uVar120 = uVar111 + uVar112;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_90;
    uVar130 = SUB168(auVar44 * ZEXT816(0),8);
    uVar113 = SUB168(auVar44 * ZEXT816(0),0);
    uVar117 = uVar114 + uVar113;
    uVar113 = (ulong)CARRY8(uVar114,uVar113);
    uVar125 = uVar120 + uVar130;
    uVar121 = uVar125 + uVar113;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uStack_88;
    uVar131 = SUB168(auVar45 * ZEXT816(0xe4437ed6010e8828),8);
    uVar114 = SUB168(auVar45 * ZEXT816(0xe4437ed6010e8828),0);
    auStack_100._64_8_ = uVar117 + uVar114;
    uVar114 = (ulong)CARRY8(uVar117,uVar114);
    uVar117 = uVar121 + uVar131;
    uVar132 = uVar117 + uVar114;
    uVar118 = (ulong)(CARRY8(uVar119,uVar118) || CARRY8(uVar111,uVar112)) +
              (ulong)(CARRY8(uVar120,uVar130) || CARRY8(uVar125,uVar113)) +
              (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar114));
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uStack_90;
    uVar125 = SUB168(auVar46 * ZEXT816(0),8);
    uVar112 = SUB168(auVar46 * ZEXT816(0),0);
    uVar111 = uVar132 + uVar112;
    uVar112 = (ulong)CARRY8(uVar132,uVar112);
    uVar114 = uVar118 + uVar125;
    uVar130 = uVar114 + uVar112;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uStack_88;
    uVar117 = SUB168(auVar47 * ZEXT816(0),8);
    uVar113 = SUB168(auVar47 * ZEXT816(0),0);
    auStack_100._72_8_ = uVar111 + uVar113;
    uVar113 = (ulong)CARRY8(uVar111,uVar113);
    uVar111 = uVar130 + uVar117;
    auVar99._8_8_ =
         (ulong)(CARRY8(uVar118,uVar125) || CARRY8(uVar114,uVar112)) +
         (ulong)(CARRY8(uVar130,uVar117) || CARRY8(uVar111,uVar113));
    auVar99._0_8_ = uVar111 + uVar113;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uStack_88;
    auStack_100._80_16_ = auVar48 * ZEXT816(0) + auVar99;
    psStack_128 = (secp256k1_ge *)0x1498f0;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)auStack_a0,(uint64_t *)(auStack_100 + 0x20));
    auVar49._8_8_ = 0;
    auVar49._0_8_ = auStack_60._0_8_;
    uVar114 = SUB168(auVar49 * ZEXT816(0xd765cda83db1562c),8);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar114;
    auStack_100._32_8_ = SUB168(auVar49 * ZEXT816(0xd765cda83db1562c),0);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auStack_60._0_8_;
    auVar50 = auVar50 * ZEXT816(0x8a280ac50774346d);
    uVar113 = SUB168(auVar50 + auVar106,0);
    uVar125 = SUB168(auVar50 + auVar106,8);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auStack_60._8_8_;
    uVar111 = SUB168(auVar51 * ZEXT816(0xd765cda83db1562c),8);
    uVar112 = SUB168(auVar51 * ZEXT816(0xd765cda83db1562c),0);
    auStack_100._40_8_ = uVar113 + uVar112;
    uVar112 = (ulong)CARRY8(uVar113,uVar112);
    uVar113 = uVar125 + uVar111;
    uVar117 = uVar113 + uVar112;
    uVar119 = (ulong)CARRY8(auVar50._8_8_,(ulong)CARRY8(uVar114,auVar50._0_8_)) +
              (ulong)(CARRY8(uVar125,uVar111) || CARRY8(uVar113,uVar112));
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auStack_60._0_8_;
    uVar118 = SUB168(auVar52 * ZEXT816(0xfffffffffffffffe),8);
    uVar112 = SUB168(auVar52 * ZEXT816(0xfffffffffffffffe),0);
    uVar114 = uVar117 + uVar112;
    uVar112 = (ulong)CARRY8(uVar117,uVar112);
    uVar111 = uVar119 + uVar118;
    uVar120 = uVar111 + uVar112;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auStack_60._8_8_;
    uVar130 = SUB168(auVar53 * ZEXT816(0x8a280ac50774346d),8);
    uVar113 = SUB168(auVar53 * ZEXT816(0x8a280ac50774346d),0);
    uVar117 = uVar114 + uVar113;
    uVar113 = (ulong)CARRY8(uVar114,uVar113);
    uVar125 = uVar120 + uVar130;
    uVar121 = uVar125 + uVar113;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uStack_50;
    uVar131 = SUB168(auVar54 * ZEXT816(0xd765cda83db1562c),8);
    uVar114 = SUB168(auVar54 * ZEXT816(0xd765cda83db1562c),0);
    auStack_100._48_8_ = uVar117 + uVar114;
    uVar114 = (ulong)CARRY8(uVar117,uVar114);
    uVar117 = uVar121 + uVar131;
    uVar133 = uVar117 + uVar114;
    uVar132 = (ulong)(CARRY8(uVar119,uVar118) || CARRY8(uVar111,uVar112)) +
              (ulong)(CARRY8(uVar120,uVar130) || CARRY8(uVar125,uVar113)) +
              (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar114));
    auVar55._8_8_ = 0;
    auVar55._0_8_ = auStack_60._0_8_;
    uVar131 = SUB168(auVar55 * ZEXT816(0xffffffffffffffff),8);
    uVar112 = SUB168(auVar55 * ZEXT816(0xffffffffffffffff),0);
    uVar114 = uVar133 + uVar112;
    uVar112 = (ulong)CARRY8(uVar133,uVar112);
    uVar125 = uVar132 + uVar131;
    uVar133 = uVar125 + uVar112;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auStack_60._8_8_;
    uVar119 = SUB168(auVar56 * ZEXT816(0xfffffffffffffffe),8);
    uVar113 = SUB168(auVar56 * ZEXT816(0xfffffffffffffffe),0);
    uVar111 = uVar114 + uVar113;
    uVar113 = (ulong)CARRY8(uVar114,uVar113);
    uVar117 = uVar133 + uVar119;
    uVar134 = uVar117 + uVar113;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uStack_50;
    uVar120 = SUB168(auVar57 * ZEXT816(0x8a280ac50774346d),8);
    uVar114 = SUB168(auVar57 * ZEXT816(0x8a280ac50774346d),0);
    uVar130 = uVar111 + uVar114;
    uVar114 = (ulong)CARRY8(uVar111,uVar114);
    uVar118 = uVar134 + uVar120;
    uVar126 = uVar118 + uVar114;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uStack_48;
    uVar121 = SUB168(auVar58 * ZEXT816(0xd765cda83db1562c),8);
    uVar111 = SUB168(auVar58 * ZEXT816(0xd765cda83db1562c),0);
    auStack_100._56_8_ = uVar130 + uVar111;
    uVar111 = (ulong)CARRY8(uVar130,uVar111);
    uVar130 = uVar126 + uVar121;
    uVar135 = uVar130 + uVar111;
    uVar119 = (ulong)(CARRY8(uVar132,uVar131) || CARRY8(uVar125,uVar112)) +
              (ulong)(CARRY8(uVar133,uVar119) || CARRY8(uVar117,uVar113)) +
              (ulong)(CARRY8(uVar134,uVar120) || CARRY8(uVar118,uVar114)) +
              (ulong)(CARRY8(uVar126,uVar121) || CARRY8(uVar130,uVar111));
    auVar59._8_8_ = 0;
    auVar59._0_8_ = auStack_60._8_8_;
    uVar118 = SUB168(auVar59 * ZEXT816(0xffffffffffffffff),8);
    uVar112 = SUB168(auVar59 * ZEXT816(0xffffffffffffffff),0);
    uVar114 = uVar135 + uVar112;
    uVar112 = (ulong)CARRY8(uVar135,uVar112);
    uVar111 = uVar119 + uVar118;
    uVar120 = uVar111 + uVar112;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uStack_50;
    uVar130 = SUB168(auVar60 * ZEXT816(0xfffffffffffffffe),8);
    uVar113 = SUB168(auVar60 * ZEXT816(0xfffffffffffffffe),0);
    uVar117 = uVar114 + uVar113;
    uVar113 = (ulong)CARRY8(uVar114,uVar113);
    uVar125 = uVar120 + uVar130;
    uVar121 = uVar125 + uVar113;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uStack_48;
    uVar131 = SUB168(auVar61 * ZEXT816(0x8a280ac50774346d),8);
    uVar114 = SUB168(auVar61 * ZEXT816(0x8a280ac50774346d),0);
    auStack_100._64_8_ = uVar117 + uVar114;
    uVar114 = (ulong)CARRY8(uVar117,uVar114);
    uVar117 = uVar121 + uVar131;
    uVar132 = uVar117 + uVar114;
    uVar118 = (ulong)(CARRY8(uVar119,uVar118) || CARRY8(uVar111,uVar112)) +
              (ulong)(CARRY8(uVar120,uVar130) || CARRY8(uVar125,uVar113)) +
              (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar114));
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uStack_50;
    uVar125 = SUB168(auVar62 * ZEXT816(0xffffffffffffffff),8);
    uVar112 = SUB168(auVar62 * ZEXT816(0xffffffffffffffff),0);
    uVar111 = uVar132 + uVar112;
    uVar112 = (ulong)CARRY8(uVar132,uVar112);
    uVar114 = uVar118 + uVar125;
    uVar130 = uVar114 + uVar112;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uStack_48;
    uVar117 = SUB168(auVar63 * ZEXT816(0xfffffffffffffffe),8);
    uVar113 = SUB168(auVar63 * ZEXT816(0xfffffffffffffffe),0);
    auStack_100._72_8_ = uVar111 + uVar113;
    uVar113 = (ulong)CARRY8(uVar111,uVar113);
    uVar111 = uVar130 + uVar117;
    auVar100._8_8_ =
         (ulong)(CARRY8(uVar118,uVar125) || CARRY8(uVar114,uVar112)) +
         (ulong)(CARRY8(uVar130,uVar117) || CARRY8(uVar111,uVar113));
    auVar100._0_8_ = uVar111 + uVar113;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uStack_48;
    auStack_100._80_16_ = auVar64 * ZEXT816(0xffffffffffffffff) + auVar100;
    psStack_128 = (secp256k1_ge *)0x149a48;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)auStack_60,(uint64_t *)(auStack_100 + 0x20));
    unaff_RBP = psStack_108;
    psStack_128 = (secp256k1_ge *)0x149a60;
    secp256k1_scalar_add
              ((secp256k1_scalar *)psStack_108,(secp256k1_scalar *)auStack_a0,
               (secp256k1_scalar *)auStack_60);
    uVar112 = (unaff_RBP->x).n[0];
    uVar113 = (unaff_RBP->x).n[1];
    uVar114 = (unaff_RBP->x).n[2];
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar112;
    uVar117 = SUB168(auVar65 * ZEXT816(0xdf02967c1b23bd72),8);
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar117;
    auStack_100._32_8_ = SUB168(auVar65 * ZEXT816(0xdf02967c1b23bd72),0);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar112;
    auVar66 = auVar66 * ZEXT816(0x122e22ea20816678);
    uVar125 = SUB168(auVar66 + auVar107,0);
    uVar130 = SUB168(auVar66 + auVar107,8);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar113;
    uVar118 = SUB168(auVar67 * ZEXT816(0xdf02967c1b23bd72),8);
    uVar111 = SUB168(auVar67 * ZEXT816(0xdf02967c1b23bd72),0);
    auStack_100._40_8_ = uVar125 + uVar111;
    uVar111 = (ulong)CARRY8(uVar125,uVar111);
    uVar125 = uVar130 + uVar118;
    uVar131 = uVar125 + uVar111;
    uVar132 = (ulong)CARRY8(auVar66._8_8_,(ulong)CARRY8(uVar117,auVar66._0_8_)) +
              (ulong)(CARRY8(uVar130,uVar118) || CARRY8(uVar125,uVar111));
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar112;
    uVar119 = SUB168(auVar68 * ZEXT816(0xa5261c028812645a),8);
    uVar111 = SUB168(auVar68 * ZEXT816(0xa5261c028812645a),0);
    uVar117 = uVar131 + uVar111;
    uVar111 = (ulong)CARRY8(uVar131,uVar111);
    uVar118 = uVar132 + uVar119;
    uVar133 = uVar118 + uVar111;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar113;
    uVar120 = SUB168(auVar69 * ZEXT816(0x122e22ea20816678),8);
    uVar125 = SUB168(auVar69 * ZEXT816(0x122e22ea20816678),0);
    uVar131 = uVar117 + uVar125;
    uVar125 = (ulong)CARRY8(uVar117,uVar125);
    uVar130 = uVar133 + uVar120;
    uVar134 = uVar130 + uVar125;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar114;
    uVar121 = SUB168(auVar70 * ZEXT816(0xdf02967c1b23bd72),8);
    uVar117 = SUB168(auVar70 * ZEXT816(0xdf02967c1b23bd72),0);
    auStack_100._48_8_ = uVar131 + uVar117;
    uVar117 = (ulong)CARRY8(uVar131,uVar117);
    uVar131 = uVar134 + uVar121;
    uVar135 = uVar131 + uVar117;
    uVar126 = (ulong)(CARRY8(uVar132,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar133,uVar120) || CARRY8(uVar130,uVar125)) +
              (ulong)(CARRY8(uVar134,uVar121) || CARRY8(uVar131,uVar117));
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar112;
    uVar121 = SUB168(auVar71 * ZEXT816(0x5363ad4cc05c30e0),8);
    uVar112 = SUB168(auVar71 * ZEXT816(0x5363ad4cc05c30e0),0);
    uVar117 = uVar135 + uVar112;
    uVar111 = (ulong)CARRY8(uVar135,uVar112);
    uVar130 = uVar126 + uVar121;
    uVar135 = uVar130 + uVar111;
    uVar112 = (unaff_RBP->x).n[3];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar113;
    uVar132 = SUB168(auVar72 * ZEXT816(0xa5261c028812645a),8);
    uVar125 = SUB168(auVar72 * ZEXT816(0xa5261c028812645a),0);
    uVar118 = uVar117 + uVar125;
    uVar125 = (ulong)CARRY8(uVar117,uVar125);
    uVar131 = uVar135 + uVar132;
    uVar127 = uVar131 + uVar125;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar114;
    uVar133 = SUB168(auVar73 * ZEXT816(0x122e22ea20816678),8);
    uVar117 = SUB168(auVar73 * ZEXT816(0x122e22ea20816678),0);
    uVar120 = uVar118 + uVar117;
    uVar117 = (ulong)CARRY8(uVar118,uVar117);
    uVar119 = uVar127 + uVar133;
    uVar128 = uVar119 + uVar117;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar112;
    uVar134 = SUB168(auVar74 * ZEXT816(0xdf02967c1b23bd72),8);
    uVar118 = SUB168(auVar74 * ZEXT816(0xdf02967c1b23bd72),0);
    auStack_100._56_8_ = uVar120 + uVar118;
    uVar118 = (ulong)CARRY8(uVar120,uVar118);
    uVar120 = uVar128 + uVar134;
    uVar129 = uVar120 + uVar118;
    uVar121 = (ulong)(CARRY8(uVar126,uVar121) || CARRY8(uVar130,uVar111)) +
              (ulong)(CARRY8(uVar135,uVar132) || CARRY8(uVar131,uVar125)) +
              (ulong)(CARRY8(uVar127,uVar133) || CARRY8(uVar119,uVar117)) +
              (ulong)(CARRY8(uVar128,uVar134) || CARRY8(uVar120,uVar118));
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar113;
    uVar131 = SUB168(auVar75 * ZEXT816(0x5363ad4cc05c30e0),8);
    uVar113 = SUB168(auVar75 * ZEXT816(0x5363ad4cc05c30e0),0);
    uVar125 = uVar129 + uVar113;
    uVar113 = (ulong)CARRY8(uVar129,uVar113);
    uVar117 = uVar121 + uVar131;
    uVar132 = uVar117 + uVar113;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar114;
    uVar119 = SUB168(auVar76 * ZEXT816(0xa5261c028812645a),8);
    uVar111 = SUB168(auVar76 * ZEXT816(0xa5261c028812645a),0);
    uVar130 = uVar125 + uVar111;
    uVar111 = (ulong)CARRY8(uVar125,uVar111);
    uVar118 = uVar132 + uVar119;
    uVar133 = uVar118 + uVar111;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar112;
    uVar120 = SUB168(auVar77 * ZEXT816(0x122e22ea20816678),8);
    uVar125 = SUB168(auVar77 * ZEXT816(0x122e22ea20816678),0);
    auStack_100._64_8_ = uVar130 + uVar125;
    uVar125 = (ulong)CARRY8(uVar130,uVar125);
    uVar130 = uVar133 + uVar120;
    uVar134 = uVar130 + uVar125;
    uVar130 = (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar113)) +
              (ulong)(CARRY8(uVar132,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar133,uVar120) || CARRY8(uVar130,uVar125));
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar114;
    uVar117 = SUB168(auVar78 * ZEXT816(0x5363ad4cc05c30e0),8);
    uVar113 = SUB168(auVar78 * ZEXT816(0x5363ad4cc05c30e0),0);
    uVar125 = uVar134 + uVar113;
    uVar113 = (ulong)CARRY8(uVar134,uVar113);
    uVar111 = uVar130 + uVar117;
    uVar131 = uVar111 + uVar113;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar112;
    uVar118 = SUB168(auVar79 * ZEXT816(0xa5261c028812645a),8);
    uVar114 = SUB168(auVar79 * ZEXT816(0xa5261c028812645a),0);
    auStack_100._72_8_ = uVar125 + uVar114;
    uVar114 = (ulong)CARRY8(uVar125,uVar114);
    uVar125 = uVar131 + uVar118;
    auVar101._8_8_ =
         (ulong)(CARRY8(uVar130,uVar117) || CARRY8(uVar111,uVar113)) +
         (ulong)(CARRY8(uVar131,uVar118) || CARRY8(uVar125,uVar114));
    auVar101._0_8_ = uVar125 + uVar114;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar112;
    auStack_100._80_16_ = auVar80 * ZEXT816(0x5363ad4cc05c30e0) + auVar101;
    psStack_128 = (secp256k1_ge *)0x149bc0;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)psStack_118,(uint64_t *)(auStack_100 + 0x20));
    psStack_128 = (secp256k1_ge *)0x149bcf;
    secp256k1_scalar_negate((secp256k1_scalar *)psStack_118,(secp256k1_scalar *)psStack_118);
    psStack_128 = (secp256k1_ge *)0x149be3;
    secp256k1_scalar_add
              ((secp256k1_scalar *)psStack_118,(secp256k1_scalar *)psStack_118,
               (secp256k1_scalar *)psStack_110);
    unaff_R14 = psStack_118;
    uVar112 = (unaff_RBP->x).n[0];
    unaff_R12 = (unaff_RBP->x).n[1];
    unaff_R13 = (unaff_RBP->x).n[2];
    uVar113 = (unaff_RBP->x).n[3];
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar112;
    uVar125 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar81,8);
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar125;
    auStack_100._32_8_ = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar81,0);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = unaff_R12;
    auVar82 = ZEXT816(0xdf02967c1b23bd72) * auVar82;
    uVar111 = SUB168(auVar82 + auVar108,0);
    uVar118 = SUB168(auVar82 + auVar108,8);
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar112;
    uVar117 = SUB168(ZEXT816(0x122e22ea20816678) * auVar83,8);
    uVar114 = SUB168(ZEXT816(0x122e22ea20816678) * auVar83,0);
    auStack_100._40_8_ = uVar111 + uVar114;
    uVar114 = (ulong)CARRY8(uVar111,uVar114);
    uVar111 = uVar118 + uVar117;
    uVar130 = uVar111 + uVar114;
    uVar121 = (ulong)CARRY8(auVar82._8_8_,(ulong)CARRY8(uVar125,auVar82._0_8_)) +
              (ulong)(CARRY8(uVar118,uVar117) || CARRY8(uVar111,uVar114));
    auVar84._8_8_ = 0;
    auVar84._0_8_ = unaff_R13;
    uVar131 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar84,8);
    uVar114 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar84,0);
    uVar125 = uVar130 + uVar114;
    uVar114 = (ulong)CARRY8(uVar130,uVar114);
    uVar117 = uVar121 + uVar131;
    uVar132 = uVar117 + uVar114;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = unaff_R12;
    uVar119 = SUB168(ZEXT816(0x122e22ea20816678) * auVar85,8);
    uVar111 = SUB168(ZEXT816(0x122e22ea20816678) * auVar85,0);
    uVar130 = uVar125 + uVar111;
    uVar111 = (ulong)CARRY8(uVar125,uVar111);
    uVar118 = uVar132 + uVar119;
    uVar133 = uVar118 + uVar111;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar112;
    uVar120 = SUB168(ZEXT816(0xa5261c028812645a) * auVar86,8);
    uVar125 = SUB168(ZEXT816(0xa5261c028812645a) * auVar86,0);
    auStack_100._48_8_ = uVar130 + uVar125;
    uVar125 = (ulong)CARRY8(uVar130,uVar125);
    uVar130 = uVar133 + uVar120;
    uVar134 = uVar130 + uVar125;
    uVar133 = (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar114)) +
              (ulong)(CARRY8(uVar132,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar133,uVar120) || CARRY8(uVar130,uVar125));
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar113;
    uVar119 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar87,8);
    uVar114 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar87,0);
    uVar125 = uVar134 + uVar114;
    uVar114 = (ulong)CARRY8(uVar134,uVar114);
    uVar117 = uVar133 + uVar119;
    uVar134 = uVar117 + uVar114;
    unaff_R15 = 0x5363ad4cc05c30e0;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = unaff_R13;
    uVar120 = SUB168(ZEXT816(0x122e22ea20816678) * auVar88,8);
    uVar111 = SUB168(ZEXT816(0x122e22ea20816678) * auVar88,0);
    uVar130 = uVar125 + uVar111;
    uVar111 = (ulong)CARRY8(uVar125,uVar111);
    uVar118 = uVar134 + uVar120;
    uVar126 = uVar118 + uVar111;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = unaff_R12;
    uVar121 = SUB168(ZEXT816(0xa5261c028812645a) * auVar89,8);
    uVar125 = SUB168(ZEXT816(0xa5261c028812645a) * auVar89,0);
    uVar131 = uVar130 + uVar125;
    uVar125 = (ulong)CARRY8(uVar130,uVar125);
    uVar130 = uVar126 + uVar121;
    uVar135 = uVar130 + uVar125;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar112;
    uVar132 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar90,8);
    uVar112 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar90,0);
    auStack_100._56_8_ = uVar131 + uVar112;
    uVar112 = (ulong)CARRY8(uVar131,uVar112);
    uVar131 = uVar135 + uVar132;
    uVar127 = uVar131 + uVar112;
    uVar120 = (ulong)(CARRY8(uVar133,uVar119) || CARRY8(uVar117,uVar114)) +
              (ulong)(CARRY8(uVar134,uVar120) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar126,uVar121) || CARRY8(uVar130,uVar125)) +
              (ulong)(CARRY8(uVar135,uVar132) || CARRY8(uVar131,uVar112));
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar113;
    uVar130 = SUB168(ZEXT816(0x122e22ea20816678) * auVar91,8);
    uVar112 = SUB168(ZEXT816(0x122e22ea20816678) * auVar91,0);
    uVar111 = uVar127 + uVar112;
    uVar112 = (ulong)CARRY8(uVar127,uVar112);
    uVar125 = uVar120 + uVar130;
    uVar121 = uVar125 + uVar112;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = unaff_R13;
    uVar131 = SUB168(ZEXT816(0xa5261c028812645a) * auVar92,8);
    uVar114 = SUB168(ZEXT816(0xa5261c028812645a) * auVar92,0);
    uVar118 = uVar111 + uVar114;
    uVar114 = (ulong)CARRY8(uVar111,uVar114);
    uVar117 = uVar121 + uVar131;
    uVar132 = uVar117 + uVar114;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = unaff_R12;
    uVar119 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar93,8);
    uVar111 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar93,0);
    auStack_100._64_8_ = uVar118 + uVar111;
    uVar111 = (ulong)CARRY8(uVar118,uVar111);
    uVar118 = uVar132 + uVar119;
    uVar133 = uVar118 + uVar111;
    uVar130 = (ulong)(CARRY8(uVar120,uVar130) || CARRY8(uVar125,uVar112)) +
              (ulong)(CARRY8(uVar121,uVar131) || CARRY8(uVar117,uVar114)) +
              (ulong)(CARRY8(uVar132,uVar119) || CARRY8(uVar118,uVar111));
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar113;
    uVar117 = SUB168(ZEXT816(0xa5261c028812645a) * auVar94,8);
    uVar112 = SUB168(ZEXT816(0xa5261c028812645a) * auVar94,0);
    uVar125 = uVar133 + uVar112;
    uVar112 = (ulong)CARRY8(uVar133,uVar112);
    uVar111 = uVar130 + uVar117;
    uVar131 = uVar111 + uVar112;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = unaff_R13;
    uVar118 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar95,8);
    uVar114 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar95,0);
    auStack_100._72_8_ = uVar125 + uVar114;
    uVar114 = (ulong)CARRY8(uVar125,uVar114);
    uVar125 = uVar131 + uVar118;
    auVar102._8_8_ =
         (ulong)(CARRY8(uVar130,uVar117) || CARRY8(uVar111,uVar112)) +
         (ulong)(CARRY8(uVar131,uVar118) || CARRY8(uVar125,uVar114));
    auVar102._0_8_ = uVar125 + uVar114;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar113;
    auStack_100._80_16_ = ZEXT816(0x5363ad4cc05c30e0) * auVar96 + auVar102;
    unaff_RBX = (secp256k1_ge *)auStack_100;
    psStack_128 = (secp256k1_ge *)0x149d48;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)unaff_RBX,(uint64_t *)(auStack_100 + 0x20));
    psStack_128 = (secp256k1_ge *)0x149d56;
    a = (secp256k1_modinv64_signed62 *)unaff_RBX;
    r = (secp256k1_fe *)unaff_RBX;
    secp256k1_scalar_add
              ((secp256k1_scalar *)unaff_RBX,(secp256k1_scalar *)unaff_RBX,
               (secp256k1_scalar *)unaff_R14);
    if ((((auStack_100._0_8_ == (psStack_110->x).n[0]) &&
         (auStack_100._8_8_ == (psStack_110->x).n[1])) &&
        (auStack_100._16_8_ == (psStack_110->x).n[2])) &&
       (auStack_100._24_8_ == (psStack_110->x).n[3])) {
      psStack_128 = (secp256k1_ge *)0x149da4;
      secp256k1_scalar_negate((secp256k1_scalar *)auStack_100,(secp256k1_scalar *)unaff_R14);
      psStack_128 = (secp256k1_ge *)0x149db1;
      secp256k1_scalar_get_b32(auStack_100 + 0x20,(secp256k1_scalar *)unaff_R14);
      psStack_128 = (secp256k1_ge *)0x149dc1;
      secp256k1_scalar_get_b32(abStack_80,(secp256k1_scalar *)auStack_100);
      lVar116 = 0;
      do {
        if (auStack_100[lVar116 + 0x20] != (&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar116]
           ) {
          if ((byte)auStack_100[lVar116 + 0x20] <
              (byte)(&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar116]) goto LAB_00149dfe;
          break;
        }
        lVar116 = lVar116 + 1;
      } while (lVar116 != 0x20);
      uVar112 = 0;
      do {
        uVar137 = abStack_80[uVar112] <
                  (byte)(&secp256k1_scalar_split_lambda_verify_k1_bound)[uVar112];
        if (abStack_80[uVar112] != (&secp256k1_scalar_split_lambda_verify_k1_bound)[uVar112])
        goto LAB_00149dfc;
        uVar112 = uVar112 + 1;
        uVar137 = uVar112 < 0x20;
      } while (uVar112 != 0x20);
      do {
        psStack_128 = (secp256k1_ge *)0x149dfc;
        secp256k1_scalar_split_lambda_cold_2();
LAB_00149dfc:
      } while (!(bool)uVar137);
LAB_00149dfe:
      psVar123 = psStack_108;
      psStack_128 = (secp256k1_ge *)0x149e13;
      secp256k1_scalar_negate((secp256k1_scalar *)auStack_100,(secp256k1_scalar *)psStack_108);
      psStack_128 = (secp256k1_ge *)0x149e20;
      secp256k1_scalar_get_b32(auStack_100 + 0x20,(secp256k1_scalar *)psVar123);
      psStack_128 = (secp256k1_ge *)0x149e30;
      secp256k1_scalar_get_b32(abStack_80,(secp256k1_scalar *)auStack_100);
      lVar116 = 0;
      do {
        if (auStack_100[lVar116 + 0x20] != (&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar116]
           ) {
          if ((byte)auStack_100[lVar116 + 0x20] <
              (byte)(&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar116]) {
            return;
          }
          break;
        }
        lVar116 = lVar116 + 1;
      } while (lVar116 != 0x20);
      uVar112 = 0;
      do {
        uVar137 = abStack_80[uVar112] <
                  (byte)(&secp256k1_scalar_split_lambda_verify_k2_bound)[uVar112];
        if (abStack_80[uVar112] != (&secp256k1_scalar_split_lambda_verify_k2_bound)[uVar112])
        goto LAB_00149e6b;
        uVar112 = uVar112 + 1;
        uVar137 = uVar112 < 0x20;
      } while (uVar112 != 0x20);
      do {
        psStack_128 = (secp256k1_ge *)0x149e6b;
        secp256k1_scalar_split_lambda_cold_1();
LAB_00149e6b:
      } while (!(bool)uVar137);
      return;
    }
  }
  psStack_128 = (secp256k1_ge *)secp256k1_wnaf_const;
  secp256k1_scalar_split_lambda_cold_3();
  auStack_178._0_8_ = (((secp256k1_ge *)a)->x).n[0];
  auStack_178._8_8_ = (((secp256k1_ge *)a)->x).n[1];
  auStack_178._16_8_ = (((secp256k1_ge *)a)->x).n[2];
  auStack_178._24_8_ = (((secp256k1_ge *)a)->x).n[3];
  auStack_178._40_8_ = unaff_RBX;
  uStack_148 = unaff_R12;
  uStack_140 = unaff_R13;
  psStack_138 = unaff_R14;
  uStack_130 = unaff_R15;
  psStack_128 = unaff_RBP;
  if ((int)n < 1) {
LAB_00149ff7:
    secp256k1_wnaf_const_cold_5();
  }
  else {
    uVar110 = (uint)((ulong)auStack_178._24_8_ >> 0x3f);
    uVar115 = uVar110 ^ 1;
    iVar136 = 0;
    uVar122 = uVar115;
    if (auStack_178._16_8_ == 0xffffffffffffffff) {
      uVar122 = 0;
    }
    if (0x5d576e7357a4501c < (ulong)auStack_178._8_8_) {
      uVar115 = 0;
    }
    uVar115 = (uVar115 | uVar122 | (ulong)auStack_178._24_8_ < 0x7fffffffffffffff) ^ 1;
    uVar122 = 0;
    if (0xdfe92f46681b20a0 < (ulong)auStack_178._0_8_) {
      uVar122 = uVar115;
    }
    if (0x5d576e7357a4501d < (ulong)auStack_178._8_8_) {
      uVar122 = uVar115;
    }
    uVar122 = uVar122 | uVar110;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_178,0,(uint)auStack_178._0_8_ & 1 ^ uVar122 ^ 1);
    iVar109 = secp256k1_scalar_cond_negate((secp256k1_scalar *)auStack_178,uVar122);
    uVar122 = secp256k1_scalar_shr_int((secp256k1_scalar *)auStack_178,n);
    uVar112 = 0;
    do {
      psVar123 = (secp256k1_ge *)auStack_178;
      a = (secp256k1_modinv64_signed62 *)(ulong)n;
      uVar110 = secp256k1_scalar_shr_int((secp256k1_scalar *)psVar123,n);
      if ((int)uVar122 < 1) {
        secp256k1_wnaf_const_cold_4();
LAB_00149ff2:
        r = &psVar123->x;
        secp256k1_wnaf_const_cold_3();
        goto LAB_00149ff7;
      }
      if ((uVar122 & 1) == 0) goto LAB_00149ff2;
      uVar115 = uVar110 + (~uVar110 & 1);
      bVar97 = (byte)n & 0x1f;
      *(uint *)((long)(((secp256k1_ge *)r)->x).n + uVar112 * 4) =
           (uVar122 - ((~uVar110 & 1) << bVar97)) * iVar109;
      uVar112 = uVar112 + 1;
      iVar136 = iVar136 + n;
      uVar122 = uVar115;
    } while (iVar136 < 0x80);
    iVar109 = uVar115 * iVar109;
    *(int *)((long)(((secp256k1_ge *)r)->x).n + (uVar112 & 0xffffffff) * 4) = iVar109;
    auVar139._0_4_ = -(uint)(auStack_178._0_4_ == 0 && auStack_178._16_4_ == 0);
    auVar139._4_4_ = -(uint)(auStack_178._4_4_ == 0 && auStack_178._20_4_ == 0);
    auVar139._8_4_ = -(uint)(auStack_178._8_4_ == 0 && auStack_178._24_4_ == 0);
    auVar139._12_4_ = -(uint)(auStack_178._12_4_ == 0 && auStack_178._28_4_ == 0);
    iVar136 = movmskps(iVar109,auVar139);
    r = &psVar123->x;
    if (iVar136 == 0xf) {
      if ((int)uVar112 == (int)(CONCAT44(0 << bVar97,n + 0x7f) / (ulong)n)) {
        return;
      }
      goto LAB_0014a001;
    }
  }
  secp256k1_wnaf_const_cold_1();
LAB_0014a001:
  secp256k1_wnaf_const_cold_2();
  psVar123 = (secp256k1_ge *)a;
  psVar124 = (secp256k1_ge *)r;
  for (lVar116 = 0xd; lVar116 != 0; lVar116 = lVar116 + -1) {
    (psVar124->x).n[0] = (psVar123->x).n[0];
    psVar123 = (secp256k1_ge *)((long)psVar123 + (ulong)bVar138 * -0x10 + 8);
    psVar124 = (secp256k1_ge *)((long)psVar124 + (ulong)bVar138 * -0x10 + 8);
  }
  secp256k1_ge_verify((secp256k1_ge *)a);
  secp256k1_fe_mul(r,r,&secp256k1_const_beta);
  secp256k1_ge_verify((secp256k1_ge *)r);
  return;
}

Assistant:

static void secp256k1_fe_from_signed62(secp256k1_fe *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t M52 = UINT64_MAX >> 12;
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->n[0] =  a0                   & M52;
    r->n[1] = (a0 >> 52 | a1 << 10) & M52;
    r->n[2] = (a1 >> 42 | a2 << 20) & M52;
    r->n[3] = (a2 >> 32 | a3 << 30) & M52;
    r->n[4] = (a3 >> 22 | a4 << 40);
}